

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

void __thiscall QKeySequenceEditPrivate::resetState(QKeySequenceEditPrivate *this)

{
  QLineEdit *pQVar1;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->releaseTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  this->prevKey = -1;
  pQVar1 = this->lineEdit;
  QKeySequence::toString((SequenceFormat)&local_38);
  QLineEdit::setText(pQVar1,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = this->lineEdit;
  QMetaObject::tr((char *)&local_38,(char *)&QKeySequenceEdit::staticMetaObject,0x6d6788);
  QLineEdit::setPlaceholderText(pQVar1,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEditPrivate::resetState()
{
    if (releaseTimer.isActive())
        releaseTimer.stop();
    prevKey = -1;
    lineEdit->setText(keySequence.toString(QKeySequence::NativeText));
    lineEdit->setPlaceholderText(QKeySequenceEdit::tr("Press shortcut"));
}